

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void prvTidyPPrintXMLTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  TidyParserMemory data;
  undefined1 auVar4 [32];
  Bool BVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  Node *node_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  Node *node_01;
  bool bVar9;
  TidyParserMemory memory;
  Node *pNStack_60;
  Node *local_58;
  undefined8 local_48;
  uint uStack_40;
  
  iVar1 = *(int *)((doc->config).value + 0x62);
LAB_00147f20:
  do {
    while( true ) {
      node_00 = node;
      if (node_00 == (Node *)0x0) {
        return;
      }
      pNVar3 = node_00->next;
      if (doc->progressCallback != (TidyPPProgress)0x0) {
        (*doc->progressCallback)((TidyDoc)doc,node_00->line,node_00->column,(doc->pprint).line + 1);
      }
      if (node_00->type != RootNode) break;
      node = node_00->content;
      if (node_00->content == (Node *)0x0) {
        return;
      }
    }
    puVar8 = &switchD_00147f7e::switchdataD_0015d5b8;
    switch(node_00->type) {
    case DocTypeTag:
      PPrintDocType(doc,indent,node_00);
      break;
    case CommentTag:
      PCondFlushLineSmart(doc,indent);
      PPrintComment(doc,indent,node_00);
      break;
    case ProcInsTag:
      PPrintPI(doc,indent,node_00);
      break;
    case TextNode:
      PPrintText(doc,mode,indent,node_00);
      puVar8 = (uint *)node_00;
      break;
    default:
      BVar5 = prvTidynodeHasCM(node_00,1);
      if ((BVar5 == no) && ((node_00->type != StartEndTag || (iVar1 != 0)))) {
        if (node_00->type != RootNode) {
          iVar2 = *(int *)((doc->config).value + 0x26);
          node_01 = node_00->content;
          if (node_01 == (Node *)0x0) {
            bVar9 = true;
          }
          else {
            do {
              BVar5 = prvTidynodeIsText(node_01);
              bVar9 = BVar5 == no;
              if (!bVar9) break;
              node_01 = node_01->next;
            } while (node_01 != (Node *)0x0);
          }
          PCondFlushLineSmart(doc,indent);
          BVar5 = prvTidyXMLPreserveWhiteSpace(doc,node_00);
          uVar7 = 0;
          uStack_40 = 0;
          puVar8 = (uint *)node_00;
          if (BVar5 == no) {
            uStack_40 = indent;
            if (bVar9) {
              uVar7 = indent + iVar2;
              goto LAB_00148193;
            }
            PPrintTag(doc,mode,indent,node_00);
            uVar6 = 1;
          }
          else {
LAB_00148193:
            PPrintTag(doc,mode,uStack_40,node_00);
            if (node_00->content != (Node *)0x0) {
              PFlushLineSmart(doc,uVar7);
            }
            uVar6 = 0;
            indent = uVar7;
          }
          local_48 = (ulong)uVar6 << 0x20;
          auVar4 = ZEXT1632(CONCAT88(pNVar3,node_00)) << 0x40;
          data.mode = (undefined4)local_48;
          data.register_1 = local_48._4_4_;
          data.identity = (Parser *)auVar4._0_8_;
          data.original_node = (Node *)auVar4._8_8_;
          data.reentry_node = (Node *)auVar4._16_8_;
          data.reentry_mode = auVar4._24_4_;
          data.reentry_state = auVar4._28_4_;
          data.register_2 = uStack_40;
          data._44_4_ = 0;
          prvTidypushMemory(doc,data);
          uVar6 = uStack_40;
          if (uStack_40 < (uint)(iVar2 * 0x32)) {
            uVar6 = indent;
          }
          indent = uVar6;
          node = node_00->content;
          pNStack_60 = node_00;
          local_58 = pNVar3;
          if (node_00->content != (Node *)0x0) goto LAB_00147f20;
        }
      }
      else {
        PCondFlushLineSmart(doc,indent);
        PPrintTag(doc,mode,indent,node_00);
        puVar8 = (uint *)node_00;
      }
      break;
    case CDATATag:
      PPrintCDATA(doc,indent,node_00);
      break;
    case SectionTag:
      PPrintSection(doc,indent,node_00);
      break;
    case AspTag:
      PPrintAsp(doc,indent,node_00);
      break;
    case JsteTag:
      PPrintJste(doc,indent,node_00);
      break;
    case PhpTag:
      PPrintPhp(doc,indent,node_00);
      break;
    case XmlDecl:
      PPrintXmlDecl(doc,indent,node_00);
    }
    node = pNVar3;
    if (pNVar3 == (Node *)0x0) {
      BVar5 = prvTidyisEmptyParserStack(doc);
      node = (Node *)0x0;
      if (BVar5 == no) {
        do {
          prvTidypopMemory(doc);
          uVar7 = extraout_EDX;
          if ((local_48._4_4_ == 0) && (pNStack_60->content != (Node *)0x0)) {
            PCondFlushLineSmart(doc,uStack_40);
            uVar7 = extraout_EDX_00;
          }
          PPrintEndTag(doc,(uint)pNStack_60->element,uVar7,(Node *)puVar8);
          node = local_58;
          indent = uStack_40;
          if (local_58 != (Node *)0x0) goto LAB_00147f20;
          BVar5 = prvTidyisEmptyParserStack(doc);
        } while (BVar5 == no);
        node = (Node *)0x0;
      }
    }
  } while( true );
}

Assistant:

void TY_(PPrintXMLTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Node* next = NULL;
    
    while ( node  )
    {
        next = node->next;
        
        if (doc->progressCallback)
        {
            doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
        }
        
        if ( node->type == TextNode)
        {
            PPrintText( doc, mode, indent, node );
        }
        else if ( node->type == RootNode )
        {
            if (node->content) {
                node = node->content;
                continue;
            } else {
                break;
            }
        }
        else if ( node->type == CommentTag )
        {
            PCondFlushLineSmart( doc, indent );
            PPrintComment( doc, indent, node);
            /* PCondFlushLine( doc, 0 ); */
        }
        else if ( node->type == DocTypeTag )
            PPrintDocType( doc, indent, node );
        else if ( node->type == ProcInsTag )
            PPrintPI( doc, indent, node );
        else if ( node->type == XmlDecl )
            PPrintXmlDecl( doc, indent, node );
        else if ( node->type == CDATATag )
            PPrintCDATA( doc, indent, node );
        else if ( node->type == SectionTag )
            PPrintSection( doc, indent, node );
        else if ( node->type == AspTag )
            PPrintAsp( doc, indent, node );
        else if ( node->type == JsteTag)
            PPrintJste( doc, indent, node );
        else if ( node->type == PhpTag)
            PPrintPhp( doc, indent, node );
        else if ( TY_(nodeHasCM)(node, CM_EMPTY) ||
                  (node->type == StartEndTag && !xhtmlOut) )
        {
            PCondFlushLineSmart( doc, indent );
            PPrintTag( doc, mode, indent, node );
            /* TY_(PFlushLine)( doc, indent ); */
        }
        else if ( node->type != RootNode )  /* some kind of container element */
        {
            TidyParserMemory memory = {0};
            uint spaces = cfg( doc, TidyIndentSpaces );
            Node *content;
            Bool mixed = no;
            uint cindent;

            for ( content = node->content; content; content = content->next )
            {
                if ( TY_(nodeIsText)(content) )
                {
                    mixed = yes;
                    break;
                }
            }

            PCondFlushLineSmart( doc, indent );

            if ( TY_(XMLPreserveWhiteSpace)(doc, node) )
            {
                indent = 0;
                mixed = no;
                cindent = 0;
            }
            else if (mixed)
                cindent = indent;
            else
                cindent = indent + spaces;

            PPrintTag( doc, mode, indent, node );
            if ( !mixed && node->content )
                PFlushLineSmart( doc, cindent );
     
            memory.original_node = node;
            memory.reentry_node = next;
            memory.register_1 = mixed;
            memory.register_2 = indent;
            TY_(pushMemory)(doc, memory);

            /* Prevent infinite indentation. Seriously, at what point is
               anyone going to read a file with infinite indentation? It
               slows down rendering for arbitrarily-deep test cases that
               are only meant to crash Tidy in the first place. Let's
               consider whether to remove this limitation, lower it,
               increase it, or add a new configuration option to control
               it, or even emit an info-level message about it.
             */
            if (indent < TIDY_INDENTATION_LIMIT * spaces)
                indent = cindent;

            if (node->content)
            {
                node = node->content;
                continue;
            }
        }
        
        if (next)
        {
            node = next;
            continue;
        }
        
        if ( TY_(isEmptyParserStack)(doc) == no )
        {
            /* It's possible that the reentry_node is null, because we
               only pushed this record as a marker for the end tag while
               there was no next node. Thus the loop will pop until we have
               what we need. This also closes multiple end tags.
             */
            do {
                TidyParserMemory memory = TY_(popMemory)(doc);
                Node* close_node = memory.original_node;
                Bool mixed = memory.register_1;
                indent = memory.register_2;
                
                if ( !mixed && close_node->content )
                    PCondFlushLineSmart( doc, indent );

                PPrintEndTag( doc, mode, indent, close_node );
                /* PCondFlushLine( doc, indent ); */
           
                node = memory.reentry_node;
            } while ( node == NULL && TY_(isEmptyParserStack)(doc) == no );
            continue;;
        }
        node = NULL;
    } /* while */
}